

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpdec.c
# Opt level: O0

VP8StatusCode DecodeWebPIncremental(uint8_t *data,size_t data_size,WebPDecoderConfig *config)

{
  WebPIDecoder *data_00;
  long in_RDX;
  WebPIDecoder *idec;
  size_t in_stack_00000010;
  VP8StatusCode status;
  size_t in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar1;
  VP8StatusCode local_4;
  
  uVar1 = 0;
  if (in_RDX == 0) {
    local_4 = VP8_STATUS_INVALID_PARAM;
  }
  else {
    PrintAnimationWarning((WebPDecoderConfig *)0x104487);
    data_00 = WebPIDecode((uint8_t *)config,in_stack_00000010,(WebPDecoderConfig *)idec);
    if (data_00 == (WebPIDecoder *)0x0) {
      fprintf(stderr,"Failed during WebPIDecode().\n");
      local_4 = VP8_STATUS_OUT_OF_MEMORY;
    }
    else {
      local_4 = WebPIUpdate((WebPIDecoder *)CONCAT44(uVar1,in_stack_ffffffffffffffd8),
                            (uint8_t *)data_00,in_stack_ffffffffffffffc8);
      WebPIDelete((WebPIDecoder *)0x1044ec);
    }
  }
  return local_4;
}

Assistant:

VP8StatusCode DecodeWebPIncremental(
    const uint8_t* const data, size_t data_size,
    WebPDecoderConfig* const config) {
  VP8StatusCode status = VP8_STATUS_OK;
  if (config == NULL) return VP8_STATUS_INVALID_PARAM;

  PrintAnimationWarning(config);

  // Decoding call.
  {
    WebPIDecoder* const idec = WebPIDecode(data, data_size, config);
    if (idec == NULL) {
      fprintf(stderr, "Failed during WebPIDecode().\n");
      return VP8_STATUS_OUT_OF_MEMORY;
    } else {
      status = WebPIUpdate(idec, data, data_size);
      WebPIDelete(idec);
    }
  }
  return status;
}